

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msghash32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  uint uVar71;
  int iVar72;
  uint uVar73;
  ulong uVar74;
  uint uVar75;
  long lVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong uVar81;
  code *pcVar82;
  ulong uVar83;
  ulong uVar84;
  ulong uVar85;
  ulong uVar86;
  ulong uVar87;
  ulong uVar88;
  ulong uVar89;
  ulong uVar90;
  ulong uVar91;
  ulong uVar92;
  ulong uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  int ret;
  int is_nonce_valid;
  int overflow;
  secp256k1_scalar non;
  uchar nonce32 [32];
  secp256k1_ge r;
  secp256k1_scalar msg;
  secp256k1_scalar sec;
  secp256k1_scalar n;
  uchar b [32];
  uint64_t l [8];
  uint local_2a4;
  secp256k1_context *local_2a0;
  uint local_298;
  uint local_294;
  uint local_290;
  int local_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  secp256k1_ecdsa_signature *local_240;
  secp256k1_nonce_function local_238;
  uchar *local_230;
  uchar *local_228;
  void *local_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [12];
  undefined4 uStack_1ac;
  undefined1 auStack_1a8 [12];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  uchar local_178 [32];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  int local_108;
  secp256k1_scalar local_f8;
  secp256k1_scalar local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  uchar local_98 [32];
  uint64_t local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [16];
  
  local_2a0 = ctx;
  if ((ctx->ecmult_gen_ctx).built == 0) {
    secp256k1_ecdsa_sign_cold_4();
  }
  else if (msghash32 == (uchar *)0x0) {
    secp256k1_ecdsa_sign_cold_3();
  }
  else if (signature == (secp256k1_ecdsa_signature *)0x0) {
    secp256k1_ecdsa_sign_cold_2();
  }
  else {
    if (seckey != (uchar *)0x0) {
      local_2a4 = 0;
      local_268 = (undefined1  [16])0x0;
      local_258 = (undefined1  [16])0x0;
      local_288 = (undefined1  [16])0x0;
      local_278 = (undefined1  [16])0x0;
      pcVar82 = nonce_function_rfc6979;
      if (noncefp != (secp256k1_nonce_function)0x0) {
        pcVar82 = noncefp;
      }
      local_240 = signature;
      secp256k1_scalar_set_b32(&local_d8,seckey,(int *)local_218);
      local_290 = (uint)(((local_d8.d[2] != 0 || local_d8.d[3] != 0) ||
                         (local_d8.d[1] != 0 || local_d8.d[0] != 0)) && local_218._0_4_ == 0);
      uVar71 = local_290 ^ 1;
      local_218._0_4_ = uVar71;
      uVar74 = (long)(int)uVar71 - 1;
      local_d8.d[1] = local_d8.d[1] & uVar74;
      local_d8.d[0] = (ulong)uVar71 | local_d8.d[0] & uVar74;
      local_d8.d[3] = uVar74 & local_d8.d[3];
      local_d8.d[2] = local_d8.d[2] & uVar74;
      secp256k1_scalar_set_b32(&local_f8,msghash32,(int *)0x0);
      local_298 = 0;
      local_238 = pcVar82;
      local_230 = msghash32;
      local_228 = seckey;
      local_220 = noncedata;
      do {
        bVar68 = false;
        iVar72 = (*pcVar82)(local_178,msghash32,seckey,(uchar *)0x0,noncedata,local_298);
        local_2a4 = (uint)(iVar72 != 0);
        if (iVar72 != 0) {
          secp256k1_scalar_set_b32((secp256k1_scalar *)local_198,local_178,(int *)local_218);
          local_294 = (uint)((SUB168(local_188 | local_198,8) != 0 ||
                             SUB168(local_188 | local_198,0) != 0) && local_218._0_4_ == 0);
          if (local_2a0->declassify != 0) {
            local_218._8_8_ = &local_294;
            local_218._0_8_ = 0x4d430002;
            local_208 = ZEXT816(4);
            local_1f8 = ZEXT816(0);
            auVar69._8_8_ = 0;
            auVar69._0_8_ = local_158._8_8_;
            local_158 = auVar69 << 0x40;
          }
          if (local_294 != 0) {
            local_28c = 0;
            secp256k1_ecmult_gen
                      (&local_2a0->ecmult_gen_ctx,(secp256k1_gej *)local_218,
                       (secp256k1_scalar *)local_198);
            secp256k1_ge_set_gej((secp256k1_ge *)local_158,(secp256k1_gej *)local_218);
            secp256k1_fe_impl_normalize((secp256k1_fe *)local_158);
            secp256k1_fe_impl_normalize((secp256k1_fe *)(local_138 + 8));
            secp256k1_fe_impl_get_b32(local_98,(secp256k1_fe *)local_158);
            secp256k1_scalar_set_b32((secp256k1_scalar *)local_268,local_98,&local_28c);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_268._0_8_;
            auVar33._8_8_ = 0;
            auVar33._0_8_ = local_d8.d[0];
            uVar77 = SUB168(auVar1 * auVar33,8);
            auVar66._8_8_ = 0;
            auVar66._0_8_ = uVar77;
            local_78 = SUB168(auVar1 * auVar33,0);
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_268._0_8_;
            auVar34._8_8_ = 0;
            auVar34._0_8_ = local_d8.d[1];
            auVar2 = auVar2 * auVar34;
            uVar83 = SUB168(auVar2 + auVar66,0);
            uVar88 = SUB168(auVar2 + auVar66,8);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_268._8_8_;
            auVar35._8_8_ = 0;
            auVar35._0_8_ = local_d8.d[0];
            uVar78 = SUB168(auVar3 * auVar35,8);
            uVar74 = SUB168(auVar3 * auVar35,0);
            local_70 = uVar83 + uVar74;
            uVar74 = (ulong)CARRY8(uVar83,uVar74);
            uVar83 = uVar88 + uVar78;
            uVar89 = uVar83 + uVar74;
            uVar90 = (ulong)CARRY8(auVar2._8_8_,(ulong)CARRY8(uVar77,auVar2._0_8_)) +
                     (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar83,uVar74));
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_268._0_8_;
            auVar36._8_8_ = 0;
            auVar36._0_8_ = local_d8.d[2];
            uVar79 = SUB168(auVar4 * auVar36,8);
            uVar74 = SUB168(auVar4 * auVar36,0);
            uVar77 = uVar89 + uVar74;
            uVar74 = (ulong)CARRY8(uVar89,uVar74);
            uVar78 = uVar90 + uVar79;
            uVar91 = uVar78 + uVar74;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_268._8_8_;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = local_d8.d[1];
            uVar80 = SUB168(auVar5 * auVar37,8);
            uVar83 = SUB168(auVar5 * auVar37,0);
            uVar89 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar88 = uVar91 + uVar80;
            uVar92 = uVar88 + uVar83;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_258._0_8_;
            auVar38._8_8_ = 0;
            auVar38._0_8_ = local_d8.d[0];
            uVar81 = SUB168(auVar6 * auVar38,8);
            uVar77 = SUB168(auVar6 * auVar38,0);
            local_68 = uVar89 + uVar77;
            uVar77 = (ulong)CARRY8(uVar89,uVar77);
            uVar89 = uVar92 + uVar81;
            uVar93 = uVar89 + uVar77;
            uVar84 = (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar78,uVar74)) +
                     (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar83)) +
                     (ulong)(CARRY8(uVar92,uVar81) || CARRY8(uVar89,uVar77));
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_268._0_8_;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = local_d8.d[3];
            uVar81 = SUB168(auVar7 * auVar39,8);
            uVar74 = SUB168(auVar7 * auVar39,0);
            uVar77 = uVar93 + uVar74;
            uVar74 = (ulong)CARRY8(uVar93,uVar74);
            uVar88 = uVar84 + uVar81;
            uVar93 = uVar88 + uVar74;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = local_268._8_8_;
            auVar40._8_8_ = 0;
            auVar40._0_8_ = local_d8.d[2];
            uVar90 = SUB168(auVar8 * auVar40,8);
            uVar83 = SUB168(auVar8 * auVar40,0);
            uVar78 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar89 = uVar93 + uVar90;
            uVar85 = uVar89 + uVar83;
            auVar9._8_8_ = 0;
            auVar9._0_8_ = local_258._0_8_;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = local_d8.d[1];
            uVar91 = SUB168(auVar9 * auVar41,8);
            uVar77 = SUB168(auVar9 * auVar41,0);
            uVar80 = uVar78 + uVar77;
            uVar77 = (ulong)CARRY8(uVar78,uVar77);
            uVar79 = uVar85 + uVar91;
            uVar86 = uVar79 + uVar77;
            auVar10._8_8_ = 0;
            auVar10._0_8_ = local_258._8_8_;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = local_d8.d[0];
            uVar92 = SUB168(auVar10 * auVar42,8);
            uVar78 = SUB168(auVar10 * auVar42,0);
            local_60 = uVar80 + uVar78;
            uVar78 = (ulong)CARRY8(uVar80,uVar78);
            uVar80 = uVar86 + uVar92;
            uVar87 = uVar80 + uVar78;
            uVar90 = (ulong)(CARRY8(uVar84,uVar81) || CARRY8(uVar88,uVar74)) +
                     (ulong)(CARRY8(uVar93,uVar90) || CARRY8(uVar89,uVar83)) +
                     (ulong)(CARRY8(uVar85,uVar91) || CARRY8(uVar79,uVar77)) +
                     (ulong)(CARRY8(uVar86,uVar92) || CARRY8(uVar80,uVar78));
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_268._8_8_;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = local_d8.d[3];
            uVar79 = SUB168(auVar11 * auVar43,8);
            uVar74 = SUB168(auVar11 * auVar43,0);
            uVar77 = uVar87 + uVar74;
            uVar74 = (ulong)CARRY8(uVar87,uVar74);
            uVar78 = uVar90 + uVar79;
            uVar91 = uVar78 + uVar74;
            auVar12._8_8_ = 0;
            auVar12._0_8_ = local_258._0_8_;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = local_d8.d[2];
            uVar80 = SUB168(auVar12 * auVar44,8);
            uVar83 = SUB168(auVar12 * auVar44,0);
            uVar89 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar88 = uVar91 + uVar80;
            uVar92 = uVar88 + uVar83;
            auVar13._8_8_ = 0;
            auVar13._0_8_ = local_258._8_8_;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = local_d8.d[1];
            uVar81 = SUB168(auVar13 * auVar45,8);
            uVar77 = SUB168(auVar13 * auVar45,0);
            local_58 = uVar89 + uVar77;
            uVar77 = (ulong)CARRY8(uVar89,uVar77);
            uVar89 = uVar92 + uVar81;
            uVar84 = uVar89 + uVar77;
            uVar79 = (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar78,uVar74)) +
                     (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar83)) +
                     (ulong)(CARRY8(uVar92,uVar81) || CARRY8(uVar89,uVar77));
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_258._0_8_;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = local_d8.d[3];
            uVar88 = SUB168(auVar14 * auVar46,8);
            uVar74 = SUB168(auVar14 * auVar46,0);
            uVar78 = uVar84 + uVar74;
            uVar74 = (ulong)CARRY8(uVar84,uVar74);
            uVar77 = uVar79 + uVar88;
            uVar80 = uVar77 + uVar74;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = local_258._8_8_;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = local_d8.d[2];
            uVar89 = SUB168(auVar15 * auVar47,8);
            uVar83 = SUB168(auVar15 * auVar47,0);
            local_50 = uVar78 + uVar83;
            uVar83 = (ulong)CARRY8(uVar78,uVar83);
            uVar78 = uVar80 + uVar89;
            local_48._8_8_ =
                 (ulong)(CARRY8(uVar79,uVar88) || CARRY8(uVar77,uVar74)) +
                 (ulong)(CARRY8(uVar80,uVar89) || CARRY8(uVar78,uVar83));
            local_48._0_8_ = uVar78 + uVar83;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_258._8_8_;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = local_d8.d[3];
            local_48 = auVar16 * auVar48 + local_48;
            secp256k1_scalar_reduce_512((secp256k1_scalar *)local_b8,&local_78);
            secp256k1_scalar_add
                      ((secp256k1_scalar *)local_b8,(secp256k1_scalar *)local_b8,&local_f8);
            secp256k1_scalar_inverse((secp256k1_scalar *)local_288,(secp256k1_scalar *)local_198);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_288._0_8_;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = local_b8._0_8_;
            uVar77 = SUB168(auVar17 * auVar49,8);
            auVar67._8_8_ = 0;
            auVar67._0_8_ = uVar77;
            local_78 = SUB168(auVar17 * auVar49,0);
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_288._0_8_;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = local_b8._8_8_;
            auVar18 = auVar18 * auVar50;
            uVar83 = SUB168(auVar18 + auVar67,0);
            uVar88 = SUB168(auVar18 + auVar67,8);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_288._8_8_;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = local_b8._0_8_;
            uVar78 = SUB168(auVar19 * auVar51,8);
            uVar74 = SUB168(auVar19 * auVar51,0);
            local_70 = uVar83 + uVar74;
            uVar74 = (ulong)CARRY8(uVar83,uVar74);
            uVar83 = uVar88 + uVar78;
            uVar89 = uVar83 + uVar74;
            uVar90 = (ulong)CARRY8(auVar18._8_8_,(ulong)CARRY8(uVar77,auVar18._0_8_)) +
                     (ulong)(CARRY8(uVar88,uVar78) || CARRY8(uVar83,uVar74));
            auVar20._8_8_ = 0;
            auVar20._0_8_ = local_288._0_8_;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = local_a8._0_8_;
            uVar79 = SUB168(auVar20 * auVar52,8);
            uVar74 = SUB168(auVar20 * auVar52,0);
            uVar77 = uVar89 + uVar74;
            uVar74 = (ulong)CARRY8(uVar89,uVar74);
            uVar78 = uVar90 + uVar79;
            uVar91 = uVar78 + uVar74;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = local_288._8_8_;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = local_b8._8_8_;
            uVar80 = SUB168(auVar21 * auVar53,8);
            uVar83 = SUB168(auVar21 * auVar53,0);
            uVar89 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar88 = uVar91 + uVar80;
            uVar92 = uVar88 + uVar83;
            auVar22._8_8_ = 0;
            auVar22._0_8_ = local_278._0_8_;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = local_b8._0_8_;
            uVar81 = SUB168(auVar22 * auVar54,8);
            uVar77 = SUB168(auVar22 * auVar54,0);
            local_68 = uVar89 + uVar77;
            uVar77 = (ulong)CARRY8(uVar89,uVar77);
            uVar89 = uVar92 + uVar81;
            uVar93 = uVar89 + uVar77;
            uVar84 = (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar78,uVar74)) +
                     (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar83)) +
                     (ulong)(CARRY8(uVar92,uVar81) || CARRY8(uVar89,uVar77));
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_288._0_8_;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = local_a8._8_8_;
            uVar81 = SUB168(auVar23 * auVar55,8);
            uVar74 = SUB168(auVar23 * auVar55,0);
            uVar77 = uVar93 + uVar74;
            uVar74 = (ulong)CARRY8(uVar93,uVar74);
            uVar88 = uVar84 + uVar81;
            uVar93 = uVar88 + uVar74;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = local_288._8_8_;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = local_a8._0_8_;
            uVar90 = SUB168(auVar24 * auVar56,8);
            uVar83 = SUB168(auVar24 * auVar56,0);
            uVar78 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar89 = uVar93 + uVar90;
            uVar85 = uVar89 + uVar83;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = local_278._0_8_;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = local_b8._8_8_;
            uVar91 = SUB168(auVar25 * auVar57,8);
            uVar77 = SUB168(auVar25 * auVar57,0);
            uVar80 = uVar78 + uVar77;
            uVar77 = (ulong)CARRY8(uVar78,uVar77);
            uVar79 = uVar85 + uVar91;
            uVar86 = uVar79 + uVar77;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = local_278._8_8_;
            auVar58._8_8_ = 0;
            auVar58._0_8_ = local_b8._0_8_;
            uVar92 = SUB168(auVar26 * auVar58,8);
            uVar78 = SUB168(auVar26 * auVar58,0);
            local_60 = uVar80 + uVar78;
            uVar78 = (ulong)CARRY8(uVar80,uVar78);
            uVar80 = uVar86 + uVar92;
            uVar87 = uVar80 + uVar78;
            uVar90 = (ulong)(CARRY8(uVar84,uVar81) || CARRY8(uVar88,uVar74)) +
                     (ulong)(CARRY8(uVar93,uVar90) || CARRY8(uVar89,uVar83)) +
                     (ulong)(CARRY8(uVar85,uVar91) || CARRY8(uVar79,uVar77)) +
                     (ulong)(CARRY8(uVar86,uVar92) || CARRY8(uVar80,uVar78));
            auVar27._8_8_ = 0;
            auVar27._0_8_ = local_288._8_8_;
            auVar59._8_8_ = 0;
            auVar59._0_8_ = local_a8._8_8_;
            uVar79 = SUB168(auVar27 * auVar59,8);
            uVar74 = SUB168(auVar27 * auVar59,0);
            uVar77 = uVar87 + uVar74;
            uVar74 = (ulong)CARRY8(uVar87,uVar74);
            uVar78 = uVar90 + uVar79;
            uVar91 = uVar78 + uVar74;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = local_278._0_8_;
            auVar60._8_8_ = 0;
            auVar60._0_8_ = local_a8._0_8_;
            uVar80 = SUB168(auVar28 * auVar60,8);
            uVar83 = SUB168(auVar28 * auVar60,0);
            uVar89 = uVar77 + uVar83;
            uVar83 = (ulong)CARRY8(uVar77,uVar83);
            uVar88 = uVar91 + uVar80;
            uVar92 = uVar88 + uVar83;
            auVar29._8_8_ = 0;
            auVar29._0_8_ = local_278._8_8_;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = local_b8._8_8_;
            uVar81 = SUB168(auVar29 * auVar61,8);
            uVar77 = SUB168(auVar29 * auVar61,0);
            local_58 = uVar89 + uVar77;
            uVar77 = (ulong)CARRY8(uVar89,uVar77);
            uVar89 = uVar92 + uVar81;
            uVar84 = uVar89 + uVar77;
            uVar79 = (ulong)(CARRY8(uVar90,uVar79) || CARRY8(uVar78,uVar74)) +
                     (ulong)(CARRY8(uVar91,uVar80) || CARRY8(uVar88,uVar83)) +
                     (ulong)(CARRY8(uVar92,uVar81) || CARRY8(uVar89,uVar77));
            auVar30._8_8_ = 0;
            auVar30._0_8_ = local_278._0_8_;
            auVar62._8_8_ = 0;
            auVar62._0_8_ = local_a8._8_8_;
            uVar88 = SUB168(auVar30 * auVar62,8);
            uVar74 = SUB168(auVar30 * auVar62,0);
            uVar78 = uVar84 + uVar74;
            uVar74 = (ulong)CARRY8(uVar84,uVar74);
            uVar77 = uVar79 + uVar88;
            uVar80 = uVar77 + uVar74;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = local_278._8_8_;
            auVar63._8_8_ = 0;
            auVar63._0_8_ = local_a8._0_8_;
            uVar89 = SUB168(auVar31 * auVar63,8);
            uVar83 = SUB168(auVar31 * auVar63,0);
            local_50 = uVar78 + uVar83;
            uVar83 = (ulong)CARRY8(uVar78,uVar83);
            uVar78 = uVar80 + uVar89;
            auVar65._8_8_ =
                 (ulong)(CARRY8(uVar79,uVar88) || CARRY8(uVar77,uVar74)) +
                 (ulong)(CARRY8(uVar80,uVar89) || CARRY8(uVar78,uVar83));
            auVar65._0_8_ = uVar78 + uVar83;
            auVar32._8_8_ = 0;
            auVar32._0_8_ = local_278._8_8_;
            auVar64._8_8_ = 0;
            auVar64._0_8_ = local_a8._8_8_;
            local_48 = auVar32 * auVar64 + auVar65;
            secp256k1_scalar_reduce_512((secp256k1_scalar *)local_288,&local_78);
            uVar73 = local_278._12_4_ >> 0x1f;
            uVar71 = uVar73 ^ 1;
            uVar75 = uVar71;
            if (local_278._0_8_ == 0xffffffffffffffff) {
              uVar75 = 0;
            }
            if (0x5d576e7357a4501c < (ulong)local_288._8_8_) {
              uVar71 = 0;
            }
            uVar75 = (uVar71 | uVar75 | (ulong)local_278._8_8_ < 0x7fffffffffffffff) ^ 1;
            uVar71 = 0;
            if (0xdfe92f46681b20a0 < (ulong)local_288._0_8_) {
              uVar71 = uVar75;
            }
            local_b8 = (undefined1  [16])0x0;
            local_a8 = (undefined1  [16])0x0;
            local_218 = (undefined1  [16])0x0;
            local_208 = (undefined1  [16])0x0;
            local_1f8 = (undefined1  [16])0x0;
            local_1e8 = (undefined1  [16])0x0;
            local_1d8 = (undefined1  [16])0x0;
            local_1c8 = (undefined1  [16])0x0;
            local_1b8 = SUB1612((undefined1  [16])0x0,0);
            uStack_1ac = 0;
            auStack_1a8 = SUB1612((undefined1  [16])0x0,4);
            local_158 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_118 = (undefined1  [16])0x0;
            local_108 = 0;
            if (0x5d576e7357a4501d < (ulong)local_288._8_8_) {
              uVar71 = uVar75;
            }
            secp256k1_scalar_cond_negate((secp256k1_scalar *)local_288,uVar71 | uVar73);
            auVar94._0_4_ = -(uint)(local_288._0_4_ == 0 && local_278._0_4_ == 0);
            auVar94._4_4_ = -(uint)(local_288._4_4_ == 0 && local_278._4_4_ == 0);
            auVar94._8_4_ = -(uint)(local_288._8_4_ == 0 && local_278._8_4_ == 0);
            auVar94._12_4_ = -(uint)(local_288._12_4_ == 0 && local_278._12_4_ == 0);
            iVar72 = movmskps(uVar75,auVar94);
            local_2a4 = (uint)(iVar72 != 0xf &&
                              (SUB168(local_268 | local_258,8) != 0 ||
                              SUB168(local_268 | local_258,0) != 0));
            if (local_2a0->declassify != 0) {
              local_218._8_8_ = &local_2a4;
              local_218._0_8_ = 0x4d430002;
              local_208 = ZEXT816(4);
              local_1f8 = ZEXT816(0);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = local_158._8_8_;
              local_158 = auVar70 << 0x40;
            }
            pcVar82 = local_238;
            seckey = local_228;
            msghash32 = local_230;
            noncedata = local_220;
            if (local_2a4 != 0) {
              bVar68 = false;
              goto LAB_00104595;
            }
          }
          local_298 = local_298 + 1;
          bVar68 = true;
        }
LAB_00104595:
        if (!bVar68) {
          uVar71 = local_290 & local_2a4 ^ 1;
          lVar76 = (long)(int)uVar71 + -1;
          auVar95._8_4_ = (int)lVar76;
          auVar95._0_8_ = lVar76;
          auVar95._12_4_ = (int)((ulong)lVar76 >> 0x20);
          local_268 = local_268 & auVar95;
          auVar95 = auVar95 & local_258;
          lVar76 = (long)(int)uVar71 + -1;
          auVar96._8_4_ = (int)lVar76;
          auVar96._0_8_ = lVar76;
          auVar96._12_4_ = (int)((ulong)lVar76 >> 0x20);
          local_288 = local_288 & auVar96;
          auVar96 = auVar96 & local_278;
          local_258._0_8_ = auVar95._0_8_;
          local_258._8_8_ = auVar95._8_8_;
          *(undefined8 *)(local_240->data + 0x10) = local_258._0_8_;
          *(undefined8 *)(local_240->data + 0x18) = local_258._8_8_;
          *(undefined8 *)local_240->data = local_268._0_8_;
          *(undefined8 *)(local_240->data + 8) = local_268._8_8_;
          local_278._0_8_ = auVar96._0_8_;
          local_278._8_8_ = auVar96._8_8_;
          *(undefined8 *)(local_240->data + 0x20) = local_288._0_8_;
          *(undefined8 *)(local_240->data + 0x28) = local_288._8_8_;
          *(undefined8 *)(local_240->data + 0x30) = local_278._0_8_;
          *(undefined8 *)(local_240->data + 0x38) = local_278._8_8_;
          return local_290 & local_2a4;
        }
      } while( true );
    }
    secp256k1_ecdsa_sign_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msghash32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, NULL, NULL, NULL, msghash32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}